

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comb_filter.hpp
# Opt level: O0

void re::math::comb_filter<float,512l,512l>(span<const_float,_512L> in,span<float,_512L> out)

{
  reference peVar1;
  float fVar2;
  span<const_float,__1L> sVar3;
  span<const_float,__1L> input;
  int local_50;
  int local_4c;
  int i;
  span_iterator<gsl::span<float,_512L>,_false> local_38;
  undefined8 local_28;
  long stage;
  long n_new;
  span<float,_512L> out_local;
  span<const_float,_512L> in_local;
  
  stage = 0;
  local_28 = 1;
  n_new = (long)out.storage_.data_;
  out_local.storage_.data_ =
       (storage_type<gsl::details::extent_type<512L>_>)
       (storage_type<gsl::details::extent_type<512L>_>)in.storage_.data_;
  ::std::begin<gsl::span<float,512l>>((span<float,_512L> *)&local_38);
  ::std::end<gsl::span<float,512l>>((span<float,_512L> *)&i);
  local_4c = 0;
  ::std::fill<gsl::details::span_iterator<gsl::span<float,512l>,false>,int>
            (&local_38,(span_iterator<gsl::span<float,_512L>,_false> *)&i,&local_4c);
  for (local_50 = 1; local_50 < 0x200; local_50 = local_50 + 1) {
    sVar3 = gsl::span<const_float,_512L>::subspan
                      ((span<const_float,_512L> *)&out_local,(long)(local_50 + -1) + 1,1);
    input.storage_.data_ = (index_type)sVar3.storage_.data_;
    input.storage_.super_extent_type<_1L>.size_ = input.storage_.data_;
    fVar2 = mean<float,_1l>((math *)sVar3.storage_.super_extent_type<_1L>.size_.size_,input);
    peVar1 = gsl::span<float,_512L>::operator[]((span<float,_512L> *)&n_new,(long)local_50);
    *peVar1 = fVar2 + *peVar1;
  }
  return;
}

Assistant:

void
comb_filter(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    static_assert(N_in >= 0 && N_out >= 0);
    static_assert(N_in % N_out == 0);

    constexpr auto n_new =  (N_in > N_out) ? N_in - N_out : 0;
    constexpr auto stage = N_in / N_out;

    if (stage > 1) {
        comb_filter(gsl::span<T const, n_new>(in.data(), n_new), out);
    } else {
        std::fill(std::begin(out), std::end(out), 0);
    }

    for (auto i = 1; i < N_out; ++i) {
        out[i] += mean(in.subspan(stage * (i - 1) + 1, 2*stage - 1));
    }
}